

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::PreAttribute(cmXMLWriter *this)

{
  char local_9;
  
  if (this->ElementOpen != false) {
    ConditionalLineBreak
              (this,this->BreakAttrib,
               (long)(this->Elements).c.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Elements).c.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (this->BreakAttrib == false) {
      local_9 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(this->Output,&local_9,1);
    }
    return;
  }
  __assert_fail("this->ElementOpen",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmXMLWriter.cxx"
                ,0x79,"void cmXMLWriter::PreAttribute()");
}

Assistant:

void cmXMLWriter::PreAttribute()
{
  assert(this->ElementOpen);
  this->ConditionalLineBreak(this->BreakAttrib, this->Elements.size());
  if (!this->BreakAttrib) {
    this->Output << ' ';
  }
}